

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O2

bool SpeedAESBlock(string *name,uint bits,string *selected)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *__ptr;
  size_t sStack_200;
  uint bits_local;
  TimeResults results;
  TimeResults results_1;
  uint8_t block [16];
  _Any_data local_1a0;
  code *local_190;
  code *local_188;
  _Any_data local_180;
  code *local_170;
  code *local_168;
  _Any_data local_160;
  code *local_150;
  code *local_148;
  _Any_data local_140;
  code *local_130;
  code *local_128;
  AES_KEY key;
  
  bits_local = bits;
  if ((selected->_M_string_length != 0) &&
     (lVar3 = std::__cxx11::string::find((string *)name,(ulong)selected), lVar3 == -1)) {
    return true;
  }
  local_140._8_8_ = 0;
  local_128 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:610:41)>
              ::_M_invoke;
  local_130 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:610:41)>
              ::_M_manager;
  local_140._M_unused._M_object = &bits_local;
  bVar1 = TimeFunctionParallel(&results,(function<bool_()> *)&local_140);
  std::_Function_base::~_Function_base((_Function_base *)&local_140);
  if (bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,name,
                   " encrypt setup");
    TimeResults::Print(&results,(string *)&key);
    std::__cxx11::string::~string((string *)&key);
    iVar2 = AES_set_encrypt_key("",bits_local,(AES_KEY *)&key);
    if (iVar2 != 0) {
      return false;
    }
    block[0] = '\0';
    block[1] = '\0';
    block[2] = '\0';
    block[3] = '\0';
    block[4] = '\0';
    block[5] = '\0';
    block[6] = '\0';
    block[7] = '\0';
    block[8] = '\0';
    block[9] = '\0';
    block[10] = '\0';
    block[0xb] = '\0';
    block[0xc] = '\0';
    block[0xd] = '\0';
    block[0xe] = '\0';
    block[0xf] = '\0';
    local_148 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:627:41)>
                ::_M_invoke;
    local_150 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:627:41)>
                ::_M_manager;
    local_160._M_unused._M_object = block;
    local_160._8_8_ = &key;
    bVar1 = TimeFunctionParallel(&results_1,(function<bool_()> *)&local_160);
    std::_Function_base::~_Function_base((_Function_base *)&local_160);
    if (!bVar1) {
      __ptr = "AES_encrypt failed.\n";
      sStack_200 = 0x14;
      goto LAB_0012a3dc;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                   name," encrypt");
    TimeResults::Print(&results_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results
                      );
    std::__cxx11::string::~string((string *)&results);
    local_180._8_8_ = 0;
    local_168 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:639:41)>
                ::_M_invoke;
    local_170 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:639:41)>
                ::_M_manager;
    local_180._M_unused._M_object = &bits_local;
    bVar1 = TimeFunctionParallel(&results,(function<bool_()> *)&local_180);
    std::_Function_base::~_Function_base((_Function_base *)&local_180);
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,name,
                     " decrypt setup");
      TimeResults::Print(&results,(string *)&key);
      std::__cxx11::string::~string((string *)&key);
      iVar2 = AES_set_decrypt_key("",bits_local,(AES_KEY *)&key);
      if (iVar2 != 0) {
        return false;
      }
      block[0] = '\0';
      block[1] = '\0';
      block[2] = '\0';
      block[3] = '\0';
      block[4] = '\0';
      block[5] = '\0';
      block[6] = '\0';
      block[7] = '\0';
      block[8] = '\0';
      block[9] = '\0';
      block[10] = '\0';
      block[0xb] = '\0';
      block[0xc] = '\0';
      block[0xd] = '\0';
      block[0xe] = '\0';
      block[0xf] = '\0';
      local_188 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:656:41)>
                  ::_M_invoke;
      local_190 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:656:41)>
                  ::_M_manager;
      local_1a0._M_unused._M_object = block;
      local_1a0._8_8_ = &key;
      bVar1 = TimeFunctionParallel(&results_1,(function<bool_()> *)&local_1a0);
      std::_Function_base::~_Function_base((_Function_base *)&local_1a0);
      if (!bVar1) {
        fwrite("AES_decrypt failed.\n",0x14,1,_stderr);
        return bVar1;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                     name," decrypt");
      TimeResults::Print(&results_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &results);
      std::__cxx11::string::~string((string *)&results);
      return bVar1;
    }
    __ptr = "AES_set_decrypt_key failed.\n";
  }
  else {
    __ptr = "AES_set_encrypt_key failed.\n";
  }
  sStack_200 = 0x1c;
LAB_0012a3dc:
  fwrite(__ptr,sStack_200,1,_stderr);
  return false;
}

Assistant:

static bool SpeedAESBlock(const std::string &name, unsigned bits,
                          const std::string &selected) {
  if (!selected.empty() && name.find(selected) == std::string::npos) {
    return true;
  }

  static const uint8_t kZero[32] = {0};

  {
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_KEY key;
          return AES_set_encrypt_key(kZero, bits, &key) == 0;
        })) {
      fprintf(stderr, "AES_set_encrypt_key failed.\n");
      return false;
    }
    results.Print(name + " encrypt setup");
  }

  {
    AES_KEY key;
    if (AES_set_encrypt_key(kZero, bits, &key) != 0) {
      return false;
    }
    uint8_t block[16] = {0};
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_encrypt(block, block, &key);
          return true;
        })) {
      fprintf(stderr, "AES_encrypt failed.\n");
      return false;
    }
    results.Print(name + " encrypt");
  }

  {
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_KEY key;
          return AES_set_decrypt_key(kZero, bits, &key) == 0;
        })) {
      fprintf(stderr, "AES_set_decrypt_key failed.\n");
      return false;
    }
    results.Print(name + " decrypt setup");
  }

  {
    AES_KEY key;
    if (AES_set_decrypt_key(kZero, bits, &key) != 0) {
      return false;
    }
    uint8_t block[16] = {0};
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_decrypt(block, block, &key);
          return true;
        })) {
      fprintf(stderr, "AES_decrypt failed.\n");
      return false;
    }
    results.Print(name + " decrypt");
  }

  return true;
}